

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::loadScene(Application *this,char *filename)

{
  int iVar1;
  ostream *poVar2;
  SceneInfo *this_00;
  SceneInfo *sceneInfo;
  Camera originalCanonicalCamera;
  Camera originalCamera;
  char *filename_local;
  Application *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Loading scene from file ");
  poVar2 = std::operator<<(poVar2,filename);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Camera::Camera((Camera *)&originalCanonicalCamera.screenDist,&this->camera);
  Camera::Camera((Camera *)&sceneInfo,&this->canonicalCamera);
  this_00 = (SceneInfo *)operator_new(0x18);
  memset(this_00,0,0x18);
  Collada::SceneInfo::SceneInfo(this_00);
  iVar1 = Collada::ColladaParser::load(filename,this_00);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: scene file failed to load.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    if (this_00 != (SceneInfo *)0x0) {
      Collada::SceneInfo::~SceneInfo(this_00);
      operator_delete(this_00,0x18);
    }
  }
  else {
    load(this,this_00);
    loadSkeleton(this,filename,this->scene);
    memcpy(&this->camera,&originalCanonicalCamera.screenDist,0xe0);
    memcpy(&this->canonicalCamera,&sceneInfo,0xe0);
  }
  return;
}

Assistant:

void Application::loadScene( const char* filename )
{
   cerr << "Loading scene from file " << filename << endl;

   Camera originalCamera = camera;
   Camera originalCanonicalCamera = canonicalCamera;

   Collada::SceneInfo *sceneInfo = new Collada::SceneInfo();
   if (Collada::ColladaParser::load(filename, sceneInfo) < 0)
   {
      cerr << "Warning: scene file failed to load." << endl;
      delete sceneInfo;
      return;
   }
   load(sceneInfo);
   loadSkeleton(filename, scene);

   camera = originalCamera;
   canonicalCamera = originalCanonicalCamera;
}